

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ContinuousPageStack.h
# Opt level: O1

void __thiscall
ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL>::PopTo
          (ContinuousPageStackOfVariableElements<UnifiedRegex::Cont,_1UL> *this,size_t position)

{
  ulong uVar1;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  
  if ((this->super_ContinuousPageStack<1UL>).nextTop < position) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,0x20e,"(position <= this->nextTop)","position <= this->nextTop");
    if (!bVar3) goto LAB_00f0686d;
    *puVar4 = 0;
  }
  uVar1 = (this->super_ContinuousPageStack<1UL>).nextTop;
  if (uVar1 != position) {
    if (uVar1 < position + 8) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,0x211,"(position + sizeof(VariableElement) <= this->nextTop)",
                         "position + sizeof(VariableElement) <= this->nextTop");
      if (!bVar3) goto LAB_00f0686d;
      *puVar4 = 0;
    }
    if ((this->super_ContinuousPageStack<1UL>).bufferSize == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                         ,199,"(bufferSize)","bufferSize");
      if (!bVar3) goto LAB_00f0686d;
      *puVar4 = 0;
    }
    this->topElementSize =
         *(size_t *)
          ((long)&(this->super_ContinuousPageStack<1UL>).pageAllocation[1].pageCount + position);
  }
  if ((this->super_ContinuousPageStack<1UL>).nextTop < position) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/ContinuousPageStack.h"
                       ,300,"(position <= nextTop)","position <= nextTop");
    if (!bVar3) {
LAB_00f0686d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar4 = 0;
  }
  (this->super_ContinuousPageStack<1UL>).nextTop = position;
  return;
}

Assistant:

inline void ContinuousPageStackOfVariableElements<T, InitialPageCount>::PopTo(const size_t position)
{
    Assert(position <= this->nextTop);
    if(position != this->nextTop)
    {
        Assert(position + sizeof(VariableElement) <= this->nextTop);
        topElementSize = reinterpret_cast<VariableElement *>(&this->Buffer()[position])->PreviousElementSize();
    }
    ContinuousPageStack<InitialPageCount>::PopTo(position);
}